

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O0

void __thiscall wasm::SuffixTree::setSuffixIndices(SuffixTree *this)

{
  bool bVar1;
  reference __in;
  ret_type pSVar2;
  size_t sVar3;
  ret_type this_00;
  size_type sVar4;
  SuffixTreeNode **__x;
  ulong uVar5;
  SuffixTreeLeafNode *LeafNode;
  pair<wasm::SuffixTreeNode_*,_unsigned_int> local_a0;
  reference local_90;
  pair<const_unsigned_int,_wasm::SuffixTreeNode_*> *ChildPair;
  iterator __end3;
  iterator __begin3;
  unordered_map<unsigned_int,_wasm::SuffixTreeNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>_>_>
  *__range3;
  SuffixTreeInternalNode *InternalNode;
  pair<wasm::SuffixTreeNode_*,_unsigned_int> local_48;
  uint local_34;
  SuffixTreeInternalNode *pSStack_30;
  uint CurrNodeLen;
  SuffixTreeNode *CurrNode;
  vector<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
  ToVisit;
  SuffixTree *this_local;
  
  ToVisit.
  super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
  ::vector((vector<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
            *)&CurrNode);
  pSStack_30 = this->Root;
  local_34 = 0;
  std::pair<wasm::SuffixTreeNode_*,_unsigned_int>::
  pair<wasm::SuffixTreeNode_*&,_unsigned_int_&,_true>
            (&local_48,(SuffixTreeNode **)&stack0xffffffffffffffd0,&local_34);
  std::
  vector<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
  ::push_back((vector<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
               *)&CurrNode,&local_48);
  do {
    bVar1 = std::
            vector<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
            ::empty((vector<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
                     *)&CurrNode);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::
      vector<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
      ::~vector((vector<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
                 *)&CurrNode);
      return;
    }
    __in = std::
           vector<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
           ::back((vector<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
                   *)&CurrNode);
    std::tie<wasm::SuffixTreeNode*,unsigned_int>
              ((SuffixTreeNode **)&InternalNode,(uint *)&stack0xffffffffffffffd0);
    std::tuple<wasm::SuffixTreeNode*&,unsigned_int&>::operator=
              ((tuple<wasm::SuffixTreeNode*&,unsigned_int&> *)&InternalNode,__in);
    std::
    vector<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
    ::pop_back((vector<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
                *)&CurrNode);
    SuffixTreeNode::setConcatLen(&pSStack_30->super_SuffixTreeNode,local_34);
    pSVar2 = llvm::dyn_cast<wasm::SuffixTreeInternalNode,wasm::SuffixTreeNode>
                       (&pSStack_30->super_SuffixTreeNode);
    if (pSVar2 != (ret_type)0x0) {
      __end3 = std::
               unordered_map<unsigned_int,_wasm::SuffixTreeNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>_>_>
               ::begin(&pSVar2->Children);
      ChildPair = (pair<const_unsigned_int,_wasm::SuffixTreeNode_*> *)
                  std::
                  unordered_map<unsigned_int,_wasm::SuffixTreeNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>_>_>
                  ::end(&pSVar2->Children);
      while (bVar1 = std::__detail::operator!=
                               (&__end3.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>,_false>
                                ,(_Node_iterator_base<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>,_false>
                                  *)&ChildPair), bVar1) {
        local_90 = std::__detail::
                   _Node_iterator<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>,_false,_false>
                   ::operator*(&__end3);
        if (local_90->second == (SuffixTreeNode *)0x0) {
          __assert_fail("ChildPair.second && \"Node had a null child!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/suffix_tree.cpp"
                        ,0x6c,"void wasm::SuffixTree::setSuffixIndices()");
        }
        __x = &local_90->second;
        uVar5 = (ulong)local_34;
        sVar3 = numElementsInSubstring(local_90->second);
        LeafNode = (SuffixTreeLeafNode *)(uVar5 + sVar3);
        std::pair<wasm::SuffixTreeNode_*,_unsigned_int>::
        pair<wasm::SuffixTreeNode_*&,_unsigned_long,_true>(&local_a0,__x,(unsigned_long *)&LeafNode)
        ;
        std::
        vector<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
        ::push_back((vector<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
                     *)&CurrNode,&local_a0);
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>,_false,_false>::
        operator++(&__end3);
      }
    }
    this_00 = llvm::dyn_cast<wasm::SuffixTreeLeafNode,wasm::SuffixTreeNode>
                        (&pSStack_30->super_SuffixTreeNode);
    if (this_00 != (ret_type)0x0) {
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->Str);
      SuffixTreeLeafNode::setSuffixIdx(this_00,(int)sVar4 - local_34);
    }
  } while( true );
}

Assistant:

void SuffixTree::setSuffixIndices() {
  // List of nodes we need to visit along with the current length of the
  // string.
  std::vector<std::pair<SuffixTreeNode*, unsigned>> ToVisit;

  // Current node being visited.
  SuffixTreeNode* CurrNode = Root;

  // Sum of the lengths of the nodes down the path to the current one.
  unsigned CurrNodeLen = 0;
  ToVisit.push_back({CurrNode, CurrNodeLen});
  while (!ToVisit.empty()) {
    std::tie(CurrNode, CurrNodeLen) = ToVisit.back();
    ToVisit.pop_back();
    // Length of the current node from the root down to here.
    CurrNode->setConcatLen(CurrNodeLen);
    if (auto* InternalNode = dyn_cast<SuffixTreeInternalNode>(CurrNode)) {
      for (auto& ChildPair : InternalNode->Children) {
        assert(ChildPair.second && "Node had a null child!");
        ToVisit.push_back(
          {ChildPair.second,
           CurrNodeLen + numElementsInSubstring(ChildPair.second)});
      }
    }
    // No children, so we are at the end of the string.
    if (auto* LeafNode = dyn_cast<SuffixTreeLeafNode>(CurrNode)) {
      LeafNode->setSuffixIdx(Str.size() - CurrNodeLen);
    }
  }
}